

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall
HighsSimplexAnalysis::setup
          (HighsSimplexAnalysis *this,string *lp_name,HighsLp *lp,HighsOptions *options,
          HighsInt simplex_iteration_count_)

{
  reference pvVar1;
  reference pvVar2;
  long in_RCX;
  undefined4 *in_RDX;
  string *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  double dVar3;
  AnIterTraceRec *lcAnIter;
  HighsInt k_2;
  HighsInt last_edge_weight_mode;
  HighsInt k_1;
  HighsInt last_rebuild_reason;
  HighsInt k;
  AnIterOpRec *AnIter;
  HighsInt dual_edge_weight_strategy;
  HighsInt tran_stage_type_1;
  TranStageAnalysis *stage;
  HighsInt tran_stage_type;
  HighsScatterData *in_stack_fffffffffffff918;
  HighsSimplexAnalysis *in_stack_fffffffffffff920;
  allocator *paVar4;
  HighsTimer *in_stack_fffffffffffff930;
  size_type in_stack_fffffffffffff938;
  vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_> *in_stack_fffffffffffff940;
  HighsValueDistribution *in_stack_fffffffffffff960;
  HighsValueDistribution *value_distribution;
  double in_stack_fffffffffffff968;
  allocator *base_value_limit;
  double in_stack_fffffffffffff970;
  allocator *max_value_limit;
  HighsOptions *in_stack_fffffffffffff978;
  allocator *min_value_limit;
  HighsSimplexAnalysis *in_stack_fffffffffffff980;
  string *value_name;
  string *in_stack_fffffffffffff988;
  string *distribution_name;
  byte local_5ba;
  allocator local_5b9;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [39];
  allocator local_569;
  string local_568 [39];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  undefined1 local_479 [40];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [39];
  undefined1 local_3d9 [40];
  undefined1 local_3b1 [40];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  double *local_c0;
  int local_b4;
  undefined4 local_b0;
  int local_ac;
  undefined4 local_a8;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [36];
  int local_44;
  undefined8 *local_40;
  int local_38;
  int local_34;
  reference local_30;
  int local_28;
  undefined4 local_24;
  long local_20;
  
  *(undefined4 *)(in_RDI + 0x40) = in_RDX[1];
  *(undefined4 *)(in_RDI + 0x44) = *in_RDX;
  *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x40) + *(int *)(in_RDI + 0x44);
  local_24 = in_R8D;
  local_20 = in_RCX;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x50),(string *)(in_RDX + 0x40));
  std::__cxx11::string::operator=((string *)(in_RDI + 0x70),in_RSI);
  *(bool *)(in_RDI + 0xf0) = (*(uint *)(local_20 + 0x160) & 1) != 0;
  *(bool *)(in_RDI + 0xf1) = (*(uint *)(local_20 + 0x160) & 2) != 0;
  *(bool *)(in_RDI + 0xf2) = (*(uint *)(local_20 + 0x160) & 4) != 0;
  *(bool *)(in_RDI + 0xf4) = (*(uint *)(local_20 + 0x160) & 0x10) != 0;
  local_5ba = 1;
  if ((*(byte *)(in_RDI + 0xf1) & 1) == 0) {
    local_5ba = *(byte *)(in_RDI + 0xf2);
  }
  *(byte *)(in_RDI + 0xf6) = local_5ba & 1;
  *(undefined8 *)(in_RDI + 0x9b0) = 0;
  *(undefined8 *)(in_RDI + 0x9b8) = 0xfff0000000000000;
  *(undefined8 *)(in_RDI + 0x9c0) = 0x4014000000000000;
  setupSimplexTime(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  setupFactorTime(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  *(undefined4 *)(in_RDI + 0xa40) = local_24;
  messaging(in_stack_fffffffffffff920,(HighsLogOptions *)in_stack_fffffffffffff918);
  *(byte *)(in_RDI + 0x9c8) = *(byte *)(local_20 + 0x1da) & 1;
  *(undefined8 *)(in_RDI + 0x1d8) = 0;
  *(undefined8 *)(in_RDI + 0x1e0) = 0;
  *(undefined8 *)(in_RDI + 0x1e8) = 0;
  *(undefined8 *)(in_RDI + 0x1f0) = 0;
  *(undefined8 *)(in_RDI + 0x1f8) = 0;
  *(undefined8 *)(in_RDI + 0x200) = 0;
  *(undefined8 *)(in_RDI + 0x208) = 0;
  *(undefined8 *)(in_RDI + 0x210) = 0;
  *(undefined8 *)(in_RDI + 0x218) = 0;
  *(undefined8 *)(in_RDI + 0x220) = 0x3ff0000000000000;
  std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::resize
            (in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  pvVar1 = std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::operator[]
                     ((vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_> *)
                      (in_RDI + 0x928),0);
  std::__cxx11::string::operator=((string *)pvVar1,"FTRAN lower");
  pvVar1 = std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::operator[]
                     ((vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_> *)
                      (in_RDI + 0x928),1);
  std::__cxx11::string::operator=((string *)pvVar1,"FTRAN upper FT");
  pvVar1 = std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::operator[]
                     ((vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_> *)
                      (in_RDI + 0x928),2);
  std::__cxx11::string::operator=((string *)pvVar1,"FTRAN upper");
  pvVar1 = std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::operator[]
                     ((vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_> *)
                      (in_RDI + 0x928),3);
  std::__cxx11::string::operator=((string *)pvVar1,"BTRAN upper");
  pvVar1 = std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::operator[]
                     ((vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_> *)
                      (in_RDI + 0x928),4);
  std::__cxx11::string::operator=((string *)pvVar1,"BTRAN upper FT");
  pvVar1 = std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::operator[]
                     ((vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_> *)
                      (in_RDI + 0x928),5);
  std::__cxx11::string::operator=((string *)pvVar1,"BTRAN lower");
  for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
    local_30 = std::vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_>::operator[]
                         ((vector<TranStageAnalysis,_std::allocator<TranStageAnalysis>_> *)
                          (in_RDI + 0x928),(long)local_28);
    initialiseScatterData((HighsInt)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
    local_30->num_decision_ = 0;
    local_30->num_wrong_original_sparse_decision_ = 0;
    local_30->num_wrong_original_hyper_decision_ = 0;
    local_30->num_wrong_new_sparse_decision_ = 0;
    local_30->num_wrong_new_hyper_decision_ = 0;
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff940,
             in_stack_fffffffffffff938);
  for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8c8),(long)local_34);
    *pvVar2 = 0.05;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8e0),(long)local_34);
    *pvVar2 = 0.05;
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8f8),0);
  *pvVar2 = 0.15;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8f8),2);
  *pvVar2 = 0.1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8f8),3);
  *pvVar2 = 0.1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x8f8),5);
  *pvVar2 = 0.15;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x910),0);
  *pvVar2 = 0.1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x910),2);
  *pvVar2 = 0.1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x910),3);
  *pvVar2 = 0.1;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x910),5);
  *pvVar2 = 0.1;
  local_38 = *(int *)(local_20 + 0x170);
  if ((local_38 == -1) || (local_38 == 2)) {
    *(undefined4 *)(in_RDI + 0x948) = 0;
    *(undefined4 *)(in_RDI + 0x94c) = 0;
    *(undefined4 *)(in_RDI + 0x950) = 0;
    *(undefined4 *)(in_RDI + 0x954) = 0;
    *(undefined8 *)(in_RDI + 0x958) = 0;
    *(undefined8 *)(in_RDI + 0x960) = 0;
    *(undefined8 *)(in_RDI + 0x968) = 0;
    *(undefined8 *)(in_RDI + 0x970) = 0;
    *(undefined8 *)(in_RDI + 0x978) = 0;
    *(undefined8 *)(in_RDI + 0x980) = 0;
    *(undefined8 *)(in_RDI + 0x988) = 0;
    *(undefined8 *)(in_RDI + 0x990) = 0;
    *(undefined8 *)(in_RDI + 0x998) = 0;
    *(undefined8 *)(in_RDI + 0x9a0) = 0;
  }
  *(undefined4 *)(in_RDI + 0x1d0) = 0;
  *(undefined4 *)(in_RDI + 0x9ac) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x9a8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x114) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x10c) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x9d0) = 0xbff0000000000000;
  *(undefined8 *)(in_RDI + 0x9d8) = 0xbff0000000000000;
  *(undefined4 *)(in_RDI + 0x9e0) = 0;
  *(undefined4 *)(in_RDI + 0x9e4) = 0;
  if ((*(byte *)(in_RDI + 0xf1) & 1) != 0) {
    *(undefined4 *)(in_RDI + 0xa44) = local_24;
    local_40 = (undefined8 *)(in_RDI + 0xa48);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xa78),"BTRAN Full");
    local_40 = (undefined8 *)(in_RDI + 0xb30);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xb60),"PRICE Full");
    local_40 = (undefined8 *)(in_RDI + 0xc18);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xc48),"BTRAN BcFsCg");
    local_40 = (undefined8 *)(in_RDI + 0xd00);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xd30),"PRICE BcFsCg");
    local_40 = (undefined8 *)(in_RDI + 0xde8);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xe18),"BTRAN e_p");
    local_40 = (undefined8 *)(in_RDI + 0xed0);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xf00),"PRICE a_p");
    local_40 = (undefined8 *)(in_RDI + 0xfb8);
    std::__cxx11::string::operator=((string *)(in_RDI + 0xfe8),"FTRAN");
    local_40 = (undefined8 *)(in_RDI + 0x10a0);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x10d0),"FTRAN BFRT");
    local_40 = (undefined8 *)(in_RDI + 0x1188);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x11b8),"FTRAN DSE");
    local_40 = (undefined8 *)(in_RDI + 0x1270);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x12a0),"BTRAN PSE");
    for (local_44 = 0; local_44 < 10; local_44 = local_44 + 1) {
      local_40 = (undefined8 *)(in_RDI + 0xa48 + (long)local_44 * 0xe8);
      if (((local_44 == 5) || (local_44 == 3)) || (local_44 == 1)) {
        *local_40 = 0x3ff0000000000000;
        local_40[1] = 0x3ff0000000000000;
        *(undefined4 *)(local_40 + 2) = *(undefined4 *)(in_RDI + 0x44);
      }
      else {
        if (((local_44 == 4) || (local_44 == 2)) || (local_44 == 0)) {
          *local_40 = 0x3fa999999999999a;
          local_40[1] = 0x3fc3333333333333;
        }
        else {
          *local_40 = 0x3fa999999999999a;
          local_40[1] = 0x3fc3333333333333;
        }
        *(undefined4 *)(local_40 + 2) = *(undefined4 *)(in_RDI + 0x40);
      }
      *(undefined4 *)((long)local_40 + 0x14) = 0;
      *(undefined4 *)(local_40 + 3) = 0;
      *(undefined4 *)((long)local_40 + 0x1c) = 0;
      local_40[4] = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"",&local_69);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"density ",&local_a1);
      initialiseValueDistribution
                (in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
                 (double)in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                 in_stack_fffffffffffff968,in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    local_a8 = 0xb;
    for (local_ac = 1; local_ac < 0xc; local_ac = local_ac + 1) {
      *(undefined4 *)(in_RDI + 0x1db0 + (long)local_ac * 4) = 0;
    }
    *(undefined4 *)(in_RDI + 0x250) = 0;
    *(undefined4 *)(in_RDI + 0x254) = 0;
    *(undefined4 *)(in_RDI + 600) = 0;
    *(undefined4 *)(in_RDI + 0x850) = 0;
    *(undefined4 *)(in_RDI + 0x854) = 0;
    *(undefined4 *)(in_RDI + 0x858) = 0;
    *(undefined4 *)(in_RDI + 0x85c) = 0;
    *(undefined8 *)(in_RDI + 0x860) = 0;
    *(undefined8 *)(in_RDI + 0x868) = 0;
    *(undefined4 *)(in_RDI + 0x870) = 0;
    *(undefined4 *)(in_RDI + 0x874) = 0;
    *(undefined4 *)(in_RDI + 0x878) = 0;
    *(undefined4 *)(in_RDI + 0x87c) = 0;
    *(undefined4 *)(in_RDI + 0x880) = 0;
    *(undefined8 *)(in_RDI + 0x888) = 0x7ff0000000000000;
    *(undefined8 *)(in_RDI + 0x890) = 0;
    *(undefined4 *)(in_RDI + 0x898) = 0;
    *(undefined8 *)(in_RDI + 0x8a0) = 0;
    *(undefined8 *)(in_RDI + 0x8a8) = 0;
    *(undefined4 *)(in_RDI + 0x8b0) = 0;
    *(undefined4 *)(in_RDI + 0x8b4) = 0;
    *(undefined8 *)(in_RDI + 0x8b8) = 0;
    *(undefined8 *)(in_RDI + 0x8c0) = 0;
    local_b0 = 2;
    for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
      *(undefined4 *)(in_RDI + 0x1de0 + (long)local_b4 * 4) = 0;
    }
    *(undefined4 *)(in_RDI + 0x1358) = 0;
    *(undefined4 *)(in_RDI + 0x135c) = 1;
    local_c0 = (double *)(in_RDI + 0x1360);
    *(undefined4 *)(in_RDI + 0x13c8) = *(undefined4 *)(in_RDI + 0xa40);
    dVar3 = HighsTimer::getWallTime(in_stack_fffffffffffff930);
    *local_c0 = dVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"Primal step summary",&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"",&local_109);
    initialiseValueDistribution
              (in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
               (double)in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Dual step summary",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"",&local_159);
    initialiseValueDistribution
              (in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
               (double)in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"Simplex pivot summary",&local_181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"",&local_1a9);
    initialiseValueDistribution
              (in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
               (double)in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"Factor pivot threshold summary",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"",&local_1f9);
    initialiseValueDistribution
              (in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
               (double)in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"Numerical trouble summary",&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"",&local_249);
    initialiseValueDistribution
              (in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
               (double)in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"Edge weight error summary",&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"",&local_299);
    initialiseValueDistribution
              (in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
               (double)in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"",&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,"1 ",&local_2e9);
    initialiseValueDistribution
              (in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
               (double)in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_310,"",&local_311);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_338,"2 ",&local_339);
    initialiseValueDistribution
              (in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
               (double)in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
    std::__cxx11::string::~string(local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"FTRAN upper sparse summary - before",&local_361);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_388,"",&local_389);
    initialiseValueDistribution
              (in_stack_fffffffffffff988,(string *)in_stack_fffffffffffff980,
               (double)in_stack_fffffffffffff978,in_stack_fffffffffffff970,in_stack_fffffffffffff968
               ,in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    distribution_name = (string *)local_3b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_3b1 + 1),"FTRAN upper sparse summary - after",
               (allocator *)distribution_name);
    value_name = (string *)local_3d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_3d9 + 1),"",(allocator *)value_name);
    initialiseValueDistribution
              (distribution_name,value_name,(double)in_stack_fffffffffffff978,
               in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960);
    std::__cxx11::string::~string((string *)(local_3d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3d9);
    std::__cxx11::string::~string((string *)(local_3b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3b1);
    min_value_limit = &local_401;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_400,"FTRAN upper hyper-sparse summary - before",min_value_limit);
    max_value_limit = &local_429;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_428,"",max_value_limit);
    initialiseValueDistribution
              (distribution_name,value_name,(double)min_value_limit,(double)max_value_limit,
               in_stack_fffffffffffff968,in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    base_value_limit = &local_451;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_450,"FTRAN upper hyper-sparse summary - after",base_value_limit);
    value_distribution = (HighsValueDistribution *)local_479;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_479 + 1),"",(allocator *)value_distribution);
    initialiseValueDistribution
              (distribution_name,value_name,(double)min_value_limit,(double)max_value_limit,
               (double)base_value_limit,value_distribution);
    std::__cxx11::string::~string((string *)(local_479 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_479);
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"Cleanup dual change summary",&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"",&local_4c9);
    initialiseValueDistribution
              (distribution_name,value_name,(double)min_value_limit,(double)max_value_limit,
               (double)base_value_limit,value_distribution);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f0,"Cleanup primal change summary",&local_4f1);
    paVar4 = &local_519;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_518,"",paVar4);
    initialiseValueDistribution
              (distribution_name,value_name,(double)min_value_limit,(double)max_value_limit,
               (double)base_value_limit,value_distribution);
    std::__cxx11::string::~string(local_518);
    std::allocator<char>::~allocator((allocator<char> *)&local_519);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    paVar4 = &local_541;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_540,"Cleanup primal step summary",paVar4);
    paVar4 = &local_569;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"",paVar4);
    initialiseValueDistribution
              (distribution_name,value_name,(double)min_value_limit,(double)max_value_limit,
               (double)base_value_limit,value_distribution);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    std::__cxx11::string::~string(local_540);
    std::allocator<char>::~allocator((allocator<char> *)&local_541);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_590,"Cleanup dual step summary",&local_591);
    paVar4 = &local_5b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5b8,"",paVar4);
    initialiseValueDistribution
              (distribution_name,value_name,(double)min_value_limit,(double)max_value_limit,
               (double)base_value_limit,value_distribution);
    std::__cxx11::string::~string(local_5b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
    std::__cxx11::string::~string(local_590);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::setup(const std::string lp_name, const HighsLp& lp,
                                 const HighsOptions& options,
                                 const HighsInt simplex_iteration_count_) {
  // Copy Problem size
  numRow = lp.num_row_;
  numCol = lp.num_col_;
  numTot = numRow + numCol;
  model_name_ = lp.model_name_;
  lp_name_ = lp_name;
  // Set up analysis logic short-cuts
  analyse_lp_data = kHighsAnalysisLevelModelData & options.highs_analysis_level;
  analyse_simplex_summary_data =
      kHighsAnalysisLevelSolverSummaryData & options.highs_analysis_level;
  analyse_simplex_runtime_data =
      kHighsAnalysisLevelSolverRuntimeData & options.highs_analysis_level;
  analyse_factor_data =
      kHighsAnalysisLevelNlaData & options.highs_analysis_level;
  analyse_simplex_data =
      analyse_simplex_summary_data || analyse_simplex_runtime_data;
  highs_run_time = 0;
  last_user_log_time = -kHighsInf;
  delta_user_log_time = 5e0;

  setupSimplexTime(options);
  setupFactorTime(options);

  // Copy tolerances from options
  //  allow_dual_steepest_edge_to_devex_switch =
  //      options.simplex_dual_edge_weight_strategy ==
  //      kSimplexEdgeWeightStrategyChoose;
  //  dual_steepest_edge_weight_log_error_threshold =
  //      options.dual_steepest_edge_weight_log_error_threshold;
  //
  AnIterIt0 = simplex_iteration_count_;
  //  AnIterCostlyDseFq = 0;
  //  AnIterNumCostlyDseIt = 0;
  // Copy messaging parameter from options
  messaging(options.log_options);
  timeless_log = options.timeless_log;
  // Initialise the densities
  col_aq_density = 0;
  row_ep_density = 0;
  row_ap_density = 0;
  row_DSE_density = 0;
  col_steepest_edge_density = 0;
  col_basic_feasibility_change_density = 0;
  row_basic_feasibility_change_density = 0;
  col_BFRT_density = 0;
  primal_col_density = 0;
  // Set the row_dual_density to 1 since it's assumed all costs are at
  // least perturbed from zero, if not initially nonzero
  dual_col_density = 1;
  // Set up the data structures for scatter data
  tran_stage.resize(NUM_TRAN_STAGE_TYPE);
  tran_stage[TRAN_STAGE_FTRAN_LOWER].name_ = "FTRAN lower";
  tran_stage[TRAN_STAGE_FTRAN_UPPER_FT].name_ = "FTRAN upper FT";
  tran_stage[TRAN_STAGE_FTRAN_UPPER].name_ = "FTRAN upper";
  tran_stage[TRAN_STAGE_BTRAN_UPPER].name_ = "BTRAN upper";
  tran_stage[TRAN_STAGE_BTRAN_UPPER_FT].name_ = "BTRAN upper FT";
  tran_stage[TRAN_STAGE_BTRAN_LOWER].name_ = "BTRAN lower";
  for (HighsInt tran_stage_type = 0; tran_stage_type < NUM_TRAN_STAGE_TYPE;
       tran_stage_type++) {
    TranStageAnalysis& stage = tran_stage[tran_stage_type];
    initialiseScatterData(20, stage.rhs_density_);
    stage.num_decision_ = 0;
    stage.num_wrong_original_sparse_decision_ = 0;
    stage.num_wrong_original_hyper_decision_ = 0;
    stage.num_wrong_new_sparse_decision_ = 0;
    stage.num_wrong_new_hyper_decision_ = 0;
  }
  original_start_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);
  new_start_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);
  historical_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);
  predicted_density_tolerance.resize(NUM_TRAN_STAGE_TYPE);

  for (HighsInt tran_stage_type = 0; tran_stage_type < NUM_TRAN_STAGE_TYPE;
       tran_stage_type++) {
    original_start_density_tolerance[tran_stage_type] = 0.05;
    new_start_density_tolerance[tran_stage_type] = 0.05;
  }
  historical_density_tolerance[TRAN_STAGE_FTRAN_LOWER] = 0.15;
  historical_density_tolerance[TRAN_STAGE_FTRAN_UPPER] = 0.10;
  historical_density_tolerance[TRAN_STAGE_BTRAN_UPPER] = 0.10;
  historical_density_tolerance[TRAN_STAGE_BTRAN_LOWER] = 0.15;
  predicted_density_tolerance[TRAN_STAGE_FTRAN_LOWER] = 0.10;
  predicted_density_tolerance[TRAN_STAGE_FTRAN_UPPER] = 0.10;
  predicted_density_tolerance[TRAN_STAGE_BTRAN_UPPER] = 0.10;
  predicted_density_tolerance[TRAN_STAGE_BTRAN_LOWER] = 0.10;

  // Initialise the measures used to analyse accuracy of steepest edge weights
  //
  const HighsInt dual_edge_weight_strategy =
      options.simplex_dual_edge_weight_strategy;
  if (dual_edge_weight_strategy == kSimplexEdgeWeightStrategyChoose ||
      dual_edge_weight_strategy == kSimplexEdgeWeightStrategySteepestEdge) {
    // Initialise the measures used to analyse accuracy of steepest edge weights
    num_dual_steepest_edge_weight_check = 0;
    num_dual_steepest_edge_weight_reject = 0;
    num_wrong_low_dual_steepest_edge_weight = 0;
    num_wrong_high_dual_steepest_edge_weight = 0;
    average_frequency_low_dual_steepest_edge_weight = 0;
    average_frequency_high_dual_steepest_edge_weight = 0;
    average_log_low_dual_steepest_edge_weight_error = 0;
    average_log_high_dual_steepest_edge_weight_error = 0;
    max_average_frequency_low_dual_steepest_edge_weight = 0;
    max_average_frequency_high_dual_steepest_edge_weight = 0;
    max_sum_average_frequency_extreme_dual_steepest_edge_weight = 0;
    max_average_log_low_dual_steepest_edge_weight_error = 0;
    max_average_log_high_dual_steepest_edge_weight_error = 0;
    max_sum_average_log_extreme_dual_steepest_edge_weight_error = 0;
  }
  num_devex_framework = 0;

  num_iteration_report_since_last_header = -1;
  num_invert_report_since_last_header = -1;
  // Set values used to skip an iteration report when column (row)
  // choice has found nothing in primal (dual) simplex
  entering_variable = -1;
  pivotal_row_index = -1;

  // Set following averages to illegal values so that first average is
  // set equal to first value
  average_concurrency = -1;
  average_fraction_of_possible_minor_iterations_performed = -1;
  sum_multi_chosen = 0;
  sum_multi_finished = 0;

  if (analyse_simplex_summary_data) {
    AnIterPrevIt = simplex_iteration_count_;

    AnIterOpRec* AnIter;
    AnIter = &AnIterOp[kSimplexNlaBtranFull];
    AnIter->AnIterOpName = "BTRAN Full";
    AnIter = &AnIterOp[kSimplexNlaPriceFull];
    AnIter->AnIterOpName = "PRICE Full";
    AnIter = &AnIterOp[kSimplexNlaBtranBasicFeasibilityChange];
    AnIter->AnIterOpName = "BTRAN BcFsCg";
    AnIter = &AnIterOp[kSimplexNlaPriceBasicFeasibilityChange];
    AnIter->AnIterOpName = "PRICE BcFsCg";
    AnIter = &AnIterOp[kSimplexNlaBtranEp];
    AnIter->AnIterOpName = "BTRAN e_p";
    AnIter = &AnIterOp[kSimplexNlaPriceAp];
    AnIter->AnIterOpName = "PRICE a_p";
    AnIter = &AnIterOp[kSimplexNlaFtran];
    AnIter->AnIterOpName = "FTRAN";
    AnIter = &AnIterOp[kSimplexNlaFtranBfrt];
    AnIter->AnIterOpName = "FTRAN BFRT";
    AnIter = &AnIterOp[kSimplexNlaFtranDse];
    AnIter->AnIterOpName = "FTRAN DSE";
    AnIter = &AnIterOp[kSimplexNlaBtranPse];
    AnIter->AnIterOpName = "BTRAN PSE";
    for (HighsInt k = 0; k < kNumSimplexNlaOperation; k++) {
      AnIter = &AnIterOp[k];
      if ((k == kSimplexNlaPriceAp) ||
          (k == kSimplexNlaPriceBasicFeasibilityChange) ||
          (k == kSimplexNlaPriceFull)) {
        AnIter->AnIterOpHyperCANCEL = 1.0;
        AnIter->AnIterOpHyperTRAN = 1.0;
        AnIter->AnIterOpRsDim = numCol;
      } else {
        if ((k == kSimplexNlaBtranEp) ||
            (k == kSimplexNlaBtranBasicFeasibilityChange) ||
            (k == kSimplexNlaBtranFull)) {
          AnIter->AnIterOpHyperCANCEL = kHyperCancel;
          AnIter->AnIterOpHyperTRAN = kHyperBtranU;
        } else {
          AnIter->AnIterOpHyperCANCEL = kHyperCancel;
          AnIter->AnIterOpHyperTRAN = kHyperFtranL;
        }
        AnIter->AnIterOpRsDim = numRow;
      }
      AnIter->AnIterOpNumCa = 0;
      AnIter->AnIterOpNumHyperOp = 0;
      AnIter->AnIterOpNumHyperRs = 0;
      AnIter->AnIterOpSumLog10RsDensity = 0;
      initialiseValueDistribution("", "density ", 1e-8, 1.0, 10.0,
                                  AnIter->AnIterOp_density);
    }
    HighsInt last_rebuild_reason = kRebuildReasonCount - 1;
    for (HighsInt k = 1; k <= last_rebuild_reason; k++) AnIterNumInvert[k] = 0;
    num_col_price = 0;
    num_row_price = 0;
    num_row_price_with_switch = 0;
    num_primal_cycling_detections = 0;
    num_dual_cycling_detections = 0;
    // Initialise the dual simplex flip/shift records
    num_quad_chuzc = 0;
    num_heap_chuzc = 0;
    sum_quad_chuzc_size = 0;
    sum_heap_chuzc_size = 0;
    max_quad_chuzc_size = 0;
    max_heap_chuzc_size = 0;

    num_improve_choose_column_row_call = 0;
    num_remove_pivot_from_pack = 0;

    num_correct_dual_primal_flip = 0;
    min_correct_dual_primal_flip_dual_infeasibility = kHighsInf;
    max_correct_dual_primal_flip = 0;
    num_correct_dual_cost_shift = 0;
    max_correct_dual_cost_shift_dual_infeasibility = 0;
    max_correct_dual_cost_shift = 0;
    net_num_single_cost_shift = 0;
    num_single_cost_shift = 0;
    max_single_cost_shift = 0;
    sum_single_cost_shift = 0;
    HighsInt last_edge_weight_mode = (HighsInt)EdgeWeightMode::kSteepestEdge;
    for (HighsInt k = 0; k <= last_edge_weight_mode; k++)
      AnIterNumEdWtIt[k] = 0;
    AnIterTraceNumRec = 0;
    AnIterTraceIterDl = 1;
    AnIterTraceRec* lcAnIter = &AnIterTrace[0];
    lcAnIter->AnIterTraceIter = AnIterIt0;
    lcAnIter->AnIterTraceTime = timer_->getWallTime();
    initialiseValueDistribution("Primal step summary", "", 1e-16, 1e16, 10.0,
                                primal_step_distribution);
    initialiseValueDistribution("Dual step summary", "", 1e-16, 1e16, 10.0,
                                dual_step_distribution);
    initialiseValueDistribution("Simplex pivot summary", "", 1e-8, 1e16, 10.0,
                                simplex_pivot_distribution);
    initialiseValueDistribution("Factor pivot threshold summary", "",
                                kMinPivotThreshold, kMaxPivotThreshold,
                                kPivotThresholdChangeFactor,
                                factor_pivot_threshold_distribution);
    initialiseValueDistribution("Numerical trouble summary", "", 1e-16, 1.0,
                                10.0, numerical_trouble_distribution);
    initialiseValueDistribution("Edge weight error summary", "", 1e-16, 1.0,
                                10.0, edge_weight_error_distribution);
    initialiseValueDistribution("", "1 ", 1e-16, 1e16, 10.0,
                                cost_perturbation1_distribution);
    initialiseValueDistribution("", "2 ", 1e-16, 1e16, 10.0,
                                cost_perturbation2_distribution);
    initialiseValueDistribution("FTRAN upper sparse summary - before", "", 1e-8,
                                1.0, 10.0, before_ftran_upper_sparse_density);
    initialiseValueDistribution("FTRAN upper sparse summary - after", "", 1e-8,
                                1.0, 10.0, before_ftran_upper_hyper_density);
    initialiseValueDistribution("FTRAN upper hyper-sparse summary - before", "",
                                1e-8, 1.0, 10.0, ftran_upper_sparse_density);
    initialiseValueDistribution("FTRAN upper hyper-sparse summary - after", "",
                                1e-8, 1.0, 10.0, ftran_upper_hyper_density);
    initialiseValueDistribution("Cleanup dual change summary", "", 1e-16, 1e16,
                                10.0, cleanup_dual_change_distribution);
    initialiseValueDistribution("Cleanup primal change summary", "", 1e-16,
                                1e16, 10.0, cleanup_primal_step_distribution);
    initialiseValueDistribution("Cleanup primal step summary", "", 1e-16, 1e16,
                                10.0, cleanup_primal_change_distribution);
    initialiseValueDistribution("Cleanup dual step summary", "", 1e-16, 1e16,
                                10.0, cleanup_dual_step_distribution);
  }
}